

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::generateScene(Map *this)

{
  int iVar1;
  value_type pSVar2;
  Decorator *pDVar3;
  value_type local_30 [3];
  value_type local_18;
  Map *local_10;
  Map *this_local;
  
  local_10 = this;
  std::operator<<((ostream *)&std::cout,"class:Map method:generateScene\n");
  iVar1 = rand();
  if (iVar1 % 2 == 0) {
    pSVar2 = (value_type)operator_new(0x60);
    pDVar3 = (Decorator *)operator_new(8);
    Decorator::Decorator(pDVar3);
    Pasture::Pasture((Pasture *)pSVar2,pDVar3);
    local_30[0] = pSVar2;
    std::vector<Scene_*,_std::allocator<Scene_*>_>::push_back(&this->scenes,local_30);
  }
  else {
    pSVar2 = (value_type)operator_new(0x60);
    pDVar3 = (Decorator *)operator_new(8);
    Decorator::Decorator(pDVar3);
    Farm::Farm((Farm *)pSVar2,pDVar3);
    local_18 = pSVar2;
    std::vector<Scene_*,_std::allocator<Scene_*>_>::push_back(&this->scenes,&local_18);
  }
  return;
}

Assistant:

void Map::generateScene(void) {
    std::cout << "class:Map method:generateScene\n";
    if (rand() % 2) {
        scenes.push_back(new Farm);
    } else {
        scenes.push_back(new Pasture);
    }
}